

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O0

int myutils::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                   timeval *__timeout)

{
  int iVar1;
  undefined1 auStack_50 [4];
  int high_sock;
  timeval tv;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  fd_set *wset_local;
  fd_set *rset_local;
  SOCKET socket_local;
  
  if (__readfds != (fd_set *)0x0) {
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      __readfds->fds_bits[__arr._4_4_] = 0;
    }
  }
  if (__writefds != (fd_set *)0x0) {
    for (__arr_1._4_4_ = 0; tv.tv_usec = (__suseconds_t)__writefds, __arr_1._4_4_ < 0x10;
        __arr_1._4_4_ = __arr_1._4_4_ + 1) {
      __writefds->fds_bits[__arr_1._4_4_] = 0;
    }
  }
  if (__readfds != (fd_set *)0x0) {
    __readfds->fds_bits[__nfds / 0x40] =
         1L << ((byte)((long)__nfds % 0x40) & 0x3f) | __readfds->fds_bits[__nfds / 0x40];
  }
  if (__writefds != (fd_set *)0x0) {
    __writefds->fds_bits[__nfds / 0x40] =
         1L << ((byte)((long)__nfds % 0x40) & 0x3f) | __writefds->fds_bits[__nfds / 0x40];
  }
  _auStack_50 = 0;
  tv.tv_sec = 500000;
  iVar1 = ::select(__nfds + 1,__readfds,__writefds,(fd_set *)0x0,(timeval *)auStack_50);
  return iVar1;
}

Assistant:

int select(SOCKET socket, fd_set* rset, fd_set* wset)
    {
        if (rset) FD_ZERO(rset);
        if (wset) FD_ZERO(wset);

        if (rset) FD_SET(socket, rset);
        if (wset) FD_SET(socket, wset);

        struct timeval tv;
        tv.tv_sec = 0;
        tv.tv_usec = 500 * 1000;

        int high_sock = (int)socket;
        return ::select(high_sock + 1, rset, wset, NULL, &tv);
    }